

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false>::
Add<Memory::WriteBarrierPtr<Js::PropertyRecord_const>>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,false> *this,
          WriteBarrierPtr<const_Js::PropertyRecord> *propertyKey,PropertyAttributes attributes,
          bool isInitialized,bool isFixed,bool usedAsFixed,ScriptContext *scriptContext)

{
  unsigned_short propertyIndex;
  PropertyRecord *pPVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  undefined7 in_register_00000011;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  WriteBarrierPtr<const_Js::PropertyRecord> local_48;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  local_3c = (undefined4)CONCAT71(in_register_00000089,usedAsFixed);
  local_38 = (undefined4)CONCAT71(in_register_00000011,attributes);
  if (0xfffe < *(int *)(this + 0xc)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x3fa,"(this->GetSlotCapacity() <= MaxPropertyIndexSize)",
                                "this->GetSlotCapacity() <= MaxPropertyIndexSize");
    if (!bVar3) goto LAB_00dfe87e;
    *puVar4 = 0;
  }
  if (*(int *)(this + 0xc) <= (int)(uint)*(ushort *)(this + 0x2a)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x3fb,"(nextPropertyIndex < this->GetSlotCapacity())",
                                "nextPropertyIndex < this->GetSlotCapacity()");
    if (!bVar3) {
LAB_00dfe87e:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  local_34 = (undefined4)CONCAT71(in_register_00000081,isFixed);
  propertyIndex = *(unsigned_short *)(this + 0x2a);
  if (propertyIndex != 0xffff) {
    *(unsigned_short *)(this + 0x2a) = propertyIndex + 1;
    pPVar1 = propertyKey->ptr;
    Memory::Recycler::WBSetBit((char *)&local_48);
    local_48.ptr = pPVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_48);
    Add<Memory::WriteBarrierPtr<Js::PropertyRecord_const>>
              (this,propertyIndex,&local_48,(PropertyAttributes)local_38,isInitialized,
               local_34._0_1_,local_3c._0_1_,scriptContext);
    return;
  }
  ::Math::DefaultOverflowPolicy();
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::Add(
        TPropertyKey propertyKey,
        PropertyAttributes attributes,
        bool isInitialized, bool isFixed, bool usedAsFixed,
        ScriptContext *const scriptContext)
    {
        Assert(this->GetSlotCapacity() <= MaxPropertyIndexSize);   // slotCapacity should never exceed MaxPropertyIndexSize
        Assert(nextPropertyIndex < this->GetSlotCapacity());       // nextPropertyIndex must be ready

        Add(::Math::PostInc(nextPropertyIndex), propertyKey, attributes, isInitialized, isFixed, usedAsFixed, scriptContext);
    }